

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_stats.cpp
# Opt level: O3

int __thiscall libtorrent::find_metric_idx(libtorrent *this,string_view name)

{
  bool bVar1;
  stats_metric_impl *__it;
  long lVar2;
  ulong uVar3;
  undefined **ppuVar4;
  
  __it = (stats_metric_impl *)name._M_len;
  uVar3 = 0x49;
  lVar2 = 0;
  do {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)this,__it);
    if (bVar1) {
LAB_002f511f:
      ppuVar4 = (undefined **)((long)&(anonymous_namespace)::metrics + lVar2);
      goto LAB_002f5122;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)this,__it);
    if (bVar1) {
      lVar2 = lVar2 + 0x10;
      goto LAB_002f511f;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)this,__it);
    if (bVar1) {
      lVar2 = lVar2 + 0x20;
      goto LAB_002f511f;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)this,__it);
    if (bVar1) {
      if (lVar2 == 0x1200) {
        return -1;
      }
      ppuVar4 = (undefined **)((long)&PTR_anon_var_dwarf_e6d63e_004e4050 + lVar2);
      goto LAB_002f5122;
    }
    lVar2 = lVar2 + 0x40;
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
          ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                        *)this,__it);
  if (bVar1) {
    ppuVar4 = &PTR_anon_var_dwarf_e6e39e_004e5220;
  }
  else {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)this,__it);
    if (bVar1) {
      ppuVar4 = &PTR_anon_var_dwarf_e6e3aa_004e5230;
    }
    else {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)this,__it);
      if (!bVar1) {
        return -1;
      }
      ppuVar4 = &PTR_anon_var_dwarf_e6e3b6_004e5240;
    }
  }
LAB_002f5122:
  return *(int *)(ppuVar4 + 1);
}

Assistant:

int find_metric_idx(string_view name)
	{
		auto const i = std::find_if(std::begin(metrics), std::end(metrics)
			, [name](stats_metric_impl const& metr)
			{ return metr.name == name; });

		if (i == std::end(metrics)) return -1;
		return i->value_index;
	}